

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::ActivationLinear::SharedCtor(ActivationLinear *this)

{
  ActivationLinear *this_local;
  
  memset(&this->alpha_,0,8);
  this->_cached_size_ = 0;
  return;
}

Assistant:

void ActivationLinear::SharedCtor() {
  ::memset(&alpha_, 0, reinterpret_cast<char*>(&beta_) -
    reinterpret_cast<char*>(&alpha_) + sizeof(beta_));
  _cached_size_ = 0;
}